

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

int __thiscall
gl4cts::SparseTexture2AllocationTestCase::init
          (SparseTexture2AllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  value_type_conflict1 local_1c [3];
  SparseTexture2AllocationTestCase *local_10;
  SparseTexture2AllocationTestCase *this_local;
  
  local_10 = this;
  SparseTextureAllocationTestCase::init(&this->super_SparseTextureAllocationTestCase,ctx);
  std::vector<int,_std::allocator<int>_>::clear
            (&(this->super_SparseTextureAllocationTestCase).mSupportedTargets);
  local_1c[2] = 0x9100;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTextureAllocationTestCase).mSupportedTargets,local_1c + 2);
  local_1c[1] = 0x9102;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTextureAllocationTestCase).mSupportedTargets,local_1c + 1);
  std::vector<int,_std::allocator<int>_>::clear
            (&(this->super_SparseTextureAllocationTestCase).mFullArrayTargets);
  local_1c[0] = 0x9102;
  std::vector<int,_std::allocator<int>_>::push_back
            (&(this->super_SparseTextureAllocationTestCase).mFullArrayTargets,local_1c);
  return extraout_EAX;
}

Assistant:

void SparseTexture2AllocationTestCase::init()
{
	SparseTextureAllocationTestCase::init();

	mSupportedTargets.clear();
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
	mSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);

	mFullArrayTargets.clear();
	mFullArrayTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
}